

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

void __thiscall
Commands::Commands(Commands *this,transparent_set<Command> *commands_,
                  insensitive_map<std::string,_std::vector<const_Command_*>_> *alternators_,
                  transparent_map<std::string,_EntityType> *entities_,
                  transparent_map<std::string,_shared_ptr<Enum>_> *enums_)

{
  _Rb_tree_header *this_00;
  _Rb_tree_header *p_Var1;
  transparent_map<std::string,_shared_ptr<Enum>_> *this_01;
  uint __line;
  undefined8 this_02;
  const_iterator cVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  unsigned_short *__args;
  _Base_ptr p_Var5;
  transparent_set<Command> *__range1;
  char *__assertion;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>_>_>
  *__const_this;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  string_view name_15;
  string_view name_16;
  string_view name_17;
  string_view name_18;
  string_view name_19;
  string_view name_20;
  string_view name_21;
  string_view name_22;
  string_view name_23;
  string_view name_24;
  string_view name_25;
  string_view name_26;
  string_view name_27;
  string_view name_28;
  string_view name_29;
  string_view name_30;
  string_view name_31;
  string_view name_32;
  string_view name_33;
  string_view name_34;
  string_view name_35;
  string_view name_36;
  string_view name_37;
  string_view name_38;
  string_view name_39;
  string_view name_40;
  string_view name_41;
  string_view name_42;
  string_view name_43;
  undefined1 local_58 [16];
  _Base_ptr local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  this_00 = &(this->commands)._M_t._M_impl.super__Rb_tree_header;
  std::_Rb_tree_header::_Rb_tree_header(this_00,&(commands_->_M_t)._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->alternators)._M_t._M_impl.super__Rb_tree_header,
             &(alternators_->_M_t)._M_impl.super__Rb_tree_header);
  p_Var1 = &(this->commands_by_id)._M_t._M_impl.super__Rb_tree_header;
  (this->commands_by_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->commands_by_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->commands_by_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->commands_by_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->commands_by_id)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._8_8_ = &this->commands_by_id;
  this_01 = &this->enums;
  p_Var1 = &(this->enums)._M_t._M_impl.super__Rb_tree_header;
  std::_Rb_tree_header::_Rb_tree_header(p_Var1,&(enums_->_M_t)._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->entities)._M_t._M_impl.super__Rb_tree_header,
             &(entities_->_M_t)._M_impl.super__Rb_tree_header);
  local_38 = (_Base_ptr)&this->enum_models;
  memset(local_38,0,0x198);
  local_48 = (_Base_ptr)this_01;
  cVar2 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>>>
          ::_M_find_tr<char[13],void>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>>>
                      *)this_01,(char (*) [13])"DEFAULTMODEL");
  cVar3 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>>>
          ::_M_find_tr<char[6],void>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>>>
                      *)this_01,(char (*) [6])0x1fa247);
  cVar4 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>>>
          ::_M_find_tr<char[13],void>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>>>
                      *)this_01,(char (*) [13])"SCRIPTSTREAM");
  if ((_Rb_tree_header *)cVar3._M_node == p_Var1) {
    __assertion = "it_model != this->enums.end()";
    __line = 0x12;
  }
  else if ((_Rb_tree_header *)cVar2._M_node == p_Var1) {
    __assertion = "it_defaultmodel != this->enums.end()";
    __line = 0x13;
  }
  else {
    if ((_Rb_tree_header *)cVar4._M_node != p_Var1) {
      local_40 = (_Base_ptr)&this->enum_scriptstream;
      std::__shared_ptr<Enum,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<Enum,_(__gnu_cxx::_Lock_policy)2> *)local_38,
                 (__shared_ptr<Enum,_(__gnu_cxx::_Lock_policy)2> *)(cVar3._M_node + 2));
      std::__shared_ptr<Enum,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->enum_defaultmodels).super___shared_ptr<Enum,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<Enum,_(__gnu_cxx::_Lock_policy)2> *)(cVar2._M_node + 2));
      std::__shared_ptr<Enum,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<Enum,_(__gnu_cxx::_Lock_policy)2> *)local_40,
                 (__shared_ptr<Enum,_(__gnu_cxx::_Lock_policy)2> *)(cVar4._M_node + 2));
      this_02 = local_58._8_8_;
      for (p_Var5 = (this->commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != this_00; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5))
      {
        if (p_Var5[1].field_0x4 == '\x01') {
          __args = std::experimental::optional<unsigned_short>::operator*
                             ((optional<unsigned_short> *)&p_Var5[1].field_0x4);
          local_58._0_8_ = p_Var5 + 1;
          std::
          _Rb_tree<unsigned_short,std::pair<unsigned_short_const,Command_const*>,std::_Select1st<std::pair<unsigned_short_const,Command_const*>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,Command_const*>>>
          ::_M_emplace_equal<unsigned_short_const&,Command_const*>
                    ((_Rb_tree<unsigned_short,std::pair<unsigned_short_const,Command_const*>,std::_Select1st<std::pair<unsigned_short_const,Command_const*>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,Command_const*>>>
                      *)this_02,__args,(Command **)local_58);
        }
      }
      name.__size = (size_type)"SET_PROGRESS_TOTAL";
      name.__data = (value_type *)this;
      find_command((Commands *)local_58,name);
      (this->set_progress_total).ref = (Command *)local_58._0_8_;
      name_00.__size = (size_type)"SET_TOTAL_NUMBER_OF_MISSIONS";
      name_00.__data = (value_type *)this;
      find_command((Commands *)local_58,name_00);
      (this->set_total_number_of_missions).ref = (Command *)local_58._0_8_;
      name_01.__size = (size_type)"SET_COLLECTABLE1_TOTAL";
      name_01.__data = (value_type *)this;
      find_command((Commands *)local_58,name_01);
      (this->set_collectable1_total).ref = (Command *)local_58._0_8_;
      name_02.__size = (size_type)"SET_MISSION_RESPECT_TOTAL";
      name_02.__data = (value_type *)this;
      find_command((Commands *)local_58,name_02);
      (this->set_mission_respect_total).ref = (Command *)local_58._0_8_;
      name_03.__size = (size_type)"REGISTER_MISSION_PASSED";
      name_03.__data = (value_type *)this;
      find_command((Commands *)local_58,name_03);
      (this->register_mission_passed).ref = (Command *)local_58._0_8_;
      name_04.__size = (size_type)"REGISTER_ODDJOB_MISSION_PASSED";
      name_04.__data = (value_type *)this;
      find_command((Commands *)local_58,name_04);
      (this->register_oddjob_mission_passed).ref = (Command *)local_58._0_8_;
      name_05.__size = (size_type)"CREATE_COLLECTABLE1";
      name_05.__data = (value_type *)this;
      find_command((Commands *)local_58,name_05);
      (this->create_collectable1).ref = (Command *)local_58._0_8_;
      name_06.__size = (size_type)"AWARD_PLAYER_MISSION_RESPECT";
      name_06.__data = (value_type *)this;
      find_command((Commands *)local_58,name_06);
      (this->award_player_mission_respect).ref = (Command *)local_58._0_8_;
      name_07.__size = (size_type)"PLAYER_MADE_PROGRESS";
      name_07.__data = (value_type *)this;
      find_command((Commands *)local_58,name_07);
      (this->player_made_progress).ref = (Command *)local_58._0_8_;
      name_08.__size = (size_type)"REPEAT";
      name_08.__data = (value_type *)this;
      find_command((Commands *)local_58,name_08);
      (this->repeat).ref = (Command *)local_58._0_8_;
      name_09.__size = (size_type)"SWITCH";
      name_09.__data = (value_type *)this;
      find_command((Commands *)local_58,name_09);
      (this->switch_).ref = (Command *)local_58._0_8_;
      name_10.__size = (size_type)"CASE";
      name_10.__data = (value_type *)this;
      find_command((Commands *)local_58,name_10);
      (this->case_).ref = (Command *)local_58._0_8_;
      name_11.__size = (size_type)"SWITCH_START";
      name_11.__data = (value_type *)this;
      find_command((Commands *)local_58,name_11);
      (this->switch_start).ref = (Command *)local_58._0_8_;
      name_12.__size = (size_type)"SWITCH_CONTINUED";
      name_12.__data = (value_type *)this;
      find_command((Commands *)local_58,name_12);
      (this->switch_continued).ref = (Command *)local_58._0_8_;
      name_13.__size = (size_type)"GOSUB_FILE";
      name_13.__data = (value_type *)this;
      find_command((Commands *)local_58,name_13);
      (this->gosub_file).ref = (Command *)local_58._0_8_;
      name_14.__size = (size_type)"LAUNCH_MISSION";
      name_14.__data = (value_type *)this;
      find_command((Commands *)local_58,name_14);
      (this->launch_mission).ref = (Command *)local_58._0_8_;
      name_15.__size = (size_type)"LOAD_AND_LAUNCH_MISSION_INTERNAL";
      name_15.__data = (value_type *)this;
      find_command((Commands *)local_58,name_15);
      (this->load_and_launch_mission_internal).ref = (Command *)local_58._0_8_;
      name_16.__size = (size_type)"START_NEW_SCRIPT";
      name_16.__data = (value_type *)this;
      find_command((Commands *)local_58,name_16);
      (this->start_new_script).ref = (Command *)local_58._0_8_;
      name_17.__size = (size_type)"START_NEW_STREAMED_SCRIPT";
      name_17.__data = (value_type *)this;
      find_command((Commands *)local_58,name_17);
      (this->start_new_streamed_script).ref = (Command *)local_58._0_8_;
      name_18.__size = (size_type)"TERMINATE_THIS_SCRIPT";
      name_18.__data = (value_type *)this;
      find_command((Commands *)local_58,name_18);
      (this->terminate_this_script).ref = (Command *)local_58._0_8_;
      name_19.__size = (size_type)"SCRIPT_NAME";
      name_19.__data = (value_type *)this;
      find_command((Commands *)local_58,name_19);
      (this->script_name).ref = (Command *)local_58._0_8_;
      name_20.__size = (size_type)"RETURN";
      name_20.__data = (value_type *)this;
      find_command((Commands *)local_58,name_20);
      (this->return_).ref = (Command *)local_58._0_8_;
      name_21.__size = (size_type)"CLEO_CALL";
      name_21.__data = (value_type *)this;
      find_command((Commands *)local_58,name_21);
      (this->cleo_call).ref = (Command *)local_58._0_8_;
      name_22.__size = (size_type)"CLEO_RETURN";
      name_22.__data = (value_type *)this;
      find_command((Commands *)local_58,name_22);
      (this->cleo_return).ref = (Command *)local_58._0_8_;
      name_23.__size = (size_type)"TERMINATE_THIS_CUSTOM_SCRIPT";
      name_23.__data = (value_type *)this;
      find_command((Commands *)local_58,name_23);
      (this->terminate_this_custom_script).ref = (Command *)local_58._0_8_;
      name_24.__size = (size_type)"GOTO";
      name_24.__data = (value_type *)this;
      find_command((Commands *)local_58,name_24);
      (this->goto_).ref = (Command *)local_58._0_8_;
      name_25.__size = (size_type)"GOTO_IF_FALSE";
      name_25.__data = (value_type *)this;
      find_command((Commands *)local_58,name_25);
      (this->goto_if_false).ref = (Command *)local_58._0_8_;
      name_26.__size = (size_type)"ANDOR";
      name_26.__data = (value_type *)this;
      find_command((Commands *)local_58,name_26);
      (this->andor).ref = (Command *)local_58._0_8_;
      name_27.__size = (size_type)"SAVE_STRING_TO_DEBUG_FILE";
      name_27.__data = (value_type *)this;
      find_command((Commands *)local_58,name_27);
      (this->save_string_to_debug_file).ref = (Command *)local_58._0_8_;
      name_28.__size = (size_type)"SKIP_CUTSCENE_START";
      name_28.__data = (value_type *)this;
      find_command((Commands *)local_58,name_28);
      (this->skip_cutscene_start).ref = (Command *)local_58._0_8_;
      name_29.__size = (size_type)"SKIP_CUTSCENE_END";
      name_29.__data = (value_type *)this;
      find_command((Commands *)local_58,name_29);
      (this->skip_cutscene_end).ref = (Command *)local_58._0_8_;
      name_30.__size = (size_type)"SKIP_CUTSCENE_START_INTERNAL";
      name_30.__data = (value_type *)this;
      find_command((Commands *)local_58,name_30);
      (this->skip_cutscene_start_internal).ref = (Command *)local_58._0_8_;
      name_31.__size = (size_type)"SET";
      name_31.__data = (value_type *)this;
      find_alternator((Commands *)local_58,name_31);
      (this->set).ref = (vector<const_Command_*,_std::allocator<const_Command_*>_> *)local_58._0_8_;
      name_32.__size = (size_type)"CSET";
      name_32.__data = (value_type *)this;
      find_alternator((Commands *)local_58,name_32);
      (this->cset).ref = (vector<const_Command_*,_std::allocator<const_Command_*>_> *)local_58._0_8_
      ;
      name_33.__size = (size_type)"ADD_THING_TO_THING";
      name_33.__data = (value_type *)this;
      find_alternator((Commands *)local_58,name_33);
      (this->add_thing_to_thing).ref =
           (vector<const_Command_*,_std::allocator<const_Command_*>_> *)local_58._0_8_;
      name_34.__size = (size_type)"SUB_THING_FROM_THING";
      name_34.__data = (value_type *)this;
      find_alternator((Commands *)local_58,name_34);
      (this->sub_thing_from_thing).ref =
           (vector<const_Command_*,_std::allocator<const_Command_*>_> *)local_58._0_8_;
      name_35.__size = (size_type)"MULT_THING_BY_THING";
      name_35.__data = (value_type *)this;
      find_alternator((Commands *)local_58,name_35);
      (this->mult_thing_by_thing).ref =
           (vector<const_Command_*,_std::allocator<const_Command_*>_> *)local_58._0_8_;
      name_36.__size = (size_type)"DIV_THING_BY_THING";
      name_36.__data = (value_type *)this;
      find_alternator((Commands *)local_58,name_36);
      (this->div_thing_by_thing).ref =
           (vector<const_Command_*,_std::allocator<const_Command_*>_> *)local_58._0_8_;
      name_37.__size = (size_type)"ADD_THING_TO_THING_TIMED";
      name_37.__data = (value_type *)this;
      find_alternator((Commands *)local_58,name_37);
      (this->add_thing_to_thing_timed).ref =
           (vector<const_Command_*,_std::allocator<const_Command_*>_> *)local_58._0_8_;
      name_38.__size = (size_type)"SUB_THING_FROM_THING_TIMED";
      name_38.__data = (value_type *)this;
      find_alternator((Commands *)local_58,name_38);
      (this->sub_thing_from_thing_timed).ref =
           (vector<const_Command_*,_std::allocator<const_Command_*>_> *)local_58._0_8_;
      name_39.__size = (size_type)"IS_THING_EQUAL_TO_THING";
      name_39.__data = (value_type *)this;
      find_alternator((Commands *)local_58,name_39);
      (this->is_thing_equal_to_thing).ref =
           (vector<const_Command_*,_std::allocator<const_Command_*>_> *)local_58._0_8_;
      name_40.__size = (size_type)"IS_THING_GREATER_THAN_THING";
      name_40.__data = (value_type *)this;
      find_alternator((Commands *)local_58,name_40);
      (this->is_thing_greater_than_thing).ref =
           (vector<const_Command_*,_std::allocator<const_Command_*>_> *)local_58._0_8_;
      name_41.__size = (size_type)"IS_THING_GREATER_OR_EQUAL_TO_THING";
      name_41.__data = (value_type *)this;
      find_alternator((Commands *)local_58,name_41);
      (this->is_thing_greater_or_equal_to_thing).ref =
           (vector<const_Command_*,_std::allocator<const_Command_*>_> *)local_58._0_8_;
      name_42.__size = (size_type)"REGISTER_STREAMED_SCRIPT_INTERNAL";
      name_42.__data = (value_type *)this;
      find_command((Commands *)local_58,name_42);
      (this->register_streamed_script_internal).ref = (Command *)local_58._0_8_;
      name_43.__size = (size_type)"REQUIRE";
      name_43.__data = (value_type *)this;
      find_command((Commands *)local_58,name_43);
      (this->require).ref = (Command *)local_58._0_8_;
      return;
    }
    __assertion = "it_scriptstream != this->enums.end()";
    __line = 0x14;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/commands.cpp"
                ,__line,
                "Commands::Commands(transparent_set<Command> &&, insensitive_map<std::string, std::vector<const Command *>> &&, transparent_map<std::string, EntityType> &&, transparent_map<std::string, shared_ptr<Enum>> &&)"
               );
}

Assistant:

Commands::Commands(transparent_set<Command>&& commands_,
                   insensitive_map<std::string, std::vector<const Command*>>&& alternators_,
                   transparent_map<std::string, EntityType>&& entities_,
                   transparent_map<std::string, shared_ptr<Enum>>&& enums_)

    : commands(std::move(commands_)), alternators(std::move(alternators_)),
      enums(std::move(enums_)), entities(std::move(entities_))
{
    auto it_defaultmodel = this->enums.find("DEFAULTMODEL");
    auto it_model       = this->enums.find("MODEL");
    auto it_scriptstream= this->enums.find("SCRIPTSTREAM");

    assert(it_model != this->enums.end());
    assert(it_defaultmodel != this->enums.end());
    assert(it_scriptstream != this->enums.end());

    this->enum_models = it_model->second;
    this->enum_defaultmodels = it_defaultmodel->second;
    this->enum_scriptstream = it_scriptstream->second;
    
    for(auto& cmd : this->commands)
    {
        if(cmd.id)
            this->commands_by_id.emplace(*cmd.id, std::addressof(cmd));
    }

    this->set_progress_total            = find_command("SET_PROGRESS_TOTAL");
    this->set_total_number_of_missions  = find_command("SET_TOTAL_NUMBER_OF_MISSIONS");
    this->set_collectable1_total        = find_command("SET_COLLECTABLE1_TOTAL");
    this->set_mission_respect_total     = find_command("SET_MISSION_RESPECT_TOTAL");
    this->register_mission_passed       = find_command("REGISTER_MISSION_PASSED");
    this->register_oddjob_mission_passed= find_command("REGISTER_ODDJOB_MISSION_PASSED");
    this->create_collectable1           = find_command("CREATE_COLLECTABLE1");
    this->award_player_mission_respect  = find_command("AWARD_PLAYER_MISSION_RESPECT");
    this->player_made_progress          = find_command("PLAYER_MADE_PROGRESS");
    this->repeat                        = find_command("REPEAT");
    this->switch_                       = find_command("SWITCH");
    this->case_                         = find_command("CASE");
    this->switch_start                  = find_command("SWITCH_START");
    this->switch_continued              = find_command("SWITCH_CONTINUED");
    this->gosub_file                    = find_command("GOSUB_FILE");
    this->launch_mission                = find_command("LAUNCH_MISSION");
    this->load_and_launch_mission_internal = find_command("LOAD_AND_LAUNCH_MISSION_INTERNAL");
    this->start_new_script              = find_command("START_NEW_SCRIPT");
    this->start_new_streamed_script     = find_command("START_NEW_STREAMED_SCRIPT");
    this->terminate_this_script         = find_command("TERMINATE_THIS_SCRIPT");
    this->script_name                   = find_command("SCRIPT_NAME");
    this->return_                        = find_command("RETURN");
    this->cleo_call                     = find_command("CLEO_CALL");
    this->cleo_return                   = find_command("CLEO_RETURN");
    this->terminate_this_custom_script  = find_command("TERMINATE_THIS_CUSTOM_SCRIPT");
    this->goto_                          = find_command("GOTO");
    this->goto_if_false                 = find_command("GOTO_IF_FALSE");
    this->andor                         = find_command("ANDOR");
    this->save_string_to_debug_file     = find_command("SAVE_STRING_TO_DEBUG_FILE");
    this->skip_cutscene_start           = find_command("SKIP_CUTSCENE_START");
    this->skip_cutscene_end             = find_command("SKIP_CUTSCENE_END");
    this->skip_cutscene_start_internal  = find_command("SKIP_CUTSCENE_START_INTERNAL");
    this->set                           = find_alternator("SET");
    this->cset                          = find_alternator("CSET");
    this->add_thing_to_thing            = find_alternator("ADD_THING_TO_THING");
    this->sub_thing_from_thing          = find_alternator("SUB_THING_FROM_THING");
    this->mult_thing_by_thing           = find_alternator("MULT_THING_BY_THING");
    this->div_thing_by_thing            = find_alternator("DIV_THING_BY_THING");
    this->add_thing_to_thing_timed      = find_alternator("ADD_THING_TO_THING_TIMED");
    this->sub_thing_from_thing_timed    = find_alternator("SUB_THING_FROM_THING_TIMED");
    this->is_thing_equal_to_thing       = find_alternator("IS_THING_EQUAL_TO_THING");
    this->is_thing_greater_than_thing   = find_alternator("IS_THING_GREATER_THAN_THING");
    this->is_thing_greater_or_equal_to_thing = find_alternator("IS_THING_GREATER_OR_EQUAL_TO_THING");
    this->register_streamed_script_internal = find_command("REGISTER_STREAMED_SCRIPT_INTERNAL");
    this->require                       = find_command("REQUIRE");
}